

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O0

Own<kj::MainBuilder::Impl> __thiscall
kj::heap<kj::MainBuilder::Impl,kj::ProcessContext&,kj::StringPtr&,kj::StringPtr&,kj::StringPtr&>
          (kj *this,ProcessContext *params,StringPtr *params_1,StringPtr *params_2,
          StringPtr *params_3)

{
  ArrayPtr<const_char> version;
  ArrayPtr<const_char> briefDescription;
  Impl *this_00;
  ProcessContext *context;
  ArrayPtr<const_char> *pAVar1;
  Impl *extraout_RDX;
  Own<kj::MainBuilder::Impl> OVar2;
  StringPtr *params_local_3;
  StringPtr *params_local_2;
  StringPtr *params_local_1;
  ProcessContext *params_local;
  
  this_00 = (Impl *)operator_new(0x120);
  context = fwd<kj::ProcessContext&>(params);
  pAVar1 = &fwd<kj::StringPtr&>(params_1)->content;
  version = *pAVar1;
  pAVar1 = &fwd<kj::StringPtr&>(params_2)->content;
  briefDescription = *pAVar1;
  pAVar1 = &fwd<kj::StringPtr&>(params_3)->content;
  MainBuilder::Impl::Impl
            (this_00,context,(StringPtr)version,(StringPtr)briefDescription,(StringPtr)*pAVar1);
  Own<kj::MainBuilder::Impl>::Own
            ((Own<kj::MainBuilder::Impl> *)this,this_00,
             (Disposer *)&_::HeapDisposer<kj::MainBuilder::Impl>::instance);
  OVar2.ptr = extraout_RDX;
  OVar2.disposer = (Disposer *)this;
  return OVar2;
}

Assistant:

Own<T> heap(Params&&... params) {
  // heap<T>(...) allocates a T on the heap, forwarding the parameters to its constructor.  The
  // exact heap implementation is unspecified -- for now it is operator new, but you should not
  // assume this.  (Since we know the object size at delete time, we could actually implement an
  // allocator that is more efficient than operator new.)

  return Own<T>(new T(kj::fwd<Params>(params)...), _::HeapDisposer<T>::instance);
}